

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

void luaE_freethread(lua_State *L,lua_State *L1)

{
  LX *l;
  lua_State *L1_local;
  lua_State *L_local;
  
  luaF_close(L1,L1->stack);
  freestack(L1);
  luaM_realloc_(L,&L1[-1].hookmask,0xd8,0);
  return;
}

Assistant:

void luaE_freethread (lua_State *L, lua_State *L1) {
  LX *l = fromstate(L1);
  luaF_close(L1, L1->stack);  /* close all upvalues for this thread */
  lua_assert(L1->openupval == NULL);
  luai_userstatefree(L, L1);
  freestack(L1);
  luaM_free(L, l);
}